

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

MetadataResult ShowDatabases(ShellState *state,char **azArg,idx_t nArg)

{
  bool bVar1;
  char *zErrMsg;
  undefined1 local_20 [8];
  char *local_18;
  
  local_18 = (char *)0x0;
  duckdb_shell::ShellState::OpenDB(state,0);
  duckdb_shell::ShellState::GetRowRenderer((ShellState *)local_20,(RenderMode)state);
  ((ErrorData *)((long)local_20 + 0x10))->initialized = false;
  std::__cxx11::string::_M_replace
            ((ulong)&((ErrorData *)((long)local_20 + 0x10))->raw_message,0,
             (char *)(((ErrorData *)((long)local_20 + 0x10))->raw_message)._M_string_length,
             0x137f9ce);
  duckdb_shell_sqlite3_exec
            (state->db,"SELECT name, file FROM pragma_database_list",callback,(void *)local_20,
             &local_18);
  bVar1 = local_18 != (char *)0x0;
  if (bVar1) {
    duckdb_shell::ShellState::PrintDatabaseError(state,local_18);
    duckdb_shell_sqlite3_free(local_18);
  }
  if (local_20 != (undefined1  [8])0x0) {
    (**(code **)((long)(((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
                        local_20)->
                       super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>)._M_t.
                       super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>
                       .super__Head_base<0UL,_duckdb::DuckDB_*,_false> + 8))();
  }
  return bVar1;
}

Assistant:

MetadataResult ShowDatabases(ShellState &state, const char **azArg, idx_t nArg) {
	char *zErrMsg = 0;
	state.OpenDB(0);

	auto renderer = state.GetRowRenderer(RenderMode::LIST);
	renderer->show_header = false;
	renderer->col_sep = ": ";
	sqlite3_exec(state.db, "SELECT name, file FROM pragma_database_list", callback, renderer.get(), &zErrMsg);
	if (zErrMsg) {
		state.PrintDatabaseError(zErrMsg);
		sqlite3_free(zErrMsg);
		return MetadataResult::FAIL;
	}
	return MetadataResult::SUCCESS;
}